

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

IceTVoid * rtfi_generateDataFunc(IceTInt id,IceTInt dest,IceTSizeType *size)

{
  IceTInt *pIVar1;
  IceTInt rank;
  IceTVoid *outBuffer;
  int local_34;
  IceTVoid *local_30;
  
  pIVar1 = icetUnsafeStateGetInteger(0x87);
  icetGetIntegerv(2,&local_34);
  if (local_34 == dest) {
    icetGetTileImage(pIVar1[id],rtfi_image);
    *size = 0;
    local_30 = (IceTVoid *)0x0;
  }
  else {
    icetGetCompressedTileImage(pIVar1[id],rtfi_outSparseImage);
    icetSparseImagePackageForSend(rtfi_outSparseImage,&local_30,size);
  }
  return local_30;
}

Assistant:

static IceTVoid *rtfi_generateDataFunc(IceTInt id, IceTInt dest,
                                       IceTSizeType *size) {
    IceTInt rank;
    const IceTInt *tile_list
        = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    IceTVoid *outBuffer;

    icetGetIntegerv(ICET_RANK, &rank);
    if (dest == rank) {
      /* Special case: sending to myself.
         Just get directly to color and depth buffers. */
        icetGetTileImage(tile_list[id], rtfi_image);
        *size = 0;
        return NULL;
    }
    icetGetCompressedTileImage(tile_list[id], rtfi_outSparseImage);
    icetSparseImagePackageForSend(rtfi_outSparseImage, &outBuffer, size);
    return outBuffer;
}